

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intercom_Control_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Intercom_Control_PDU::AddIntercomCommunicationParameters
          (Intercom_Control_PDU *this,IntercomCommunicationParameters *ICP)

{
  pointer *ppIVar1;
  iterator __position;
  DataTypeBase *pDVar2;
  undefined4 uVar3;
  KUINT16 KVar4;
  
  KVar4 = DATA_TYPE::IntercomCommunicationParameters::GetLength(ICP);
  (this->super_Header).super_Header6.m_ui16PDULength =
       KVar4 + (this->super_Header).super_Header6.m_ui16PDULength + 4;
  __position._M_current =
       (this->m_vICP).
       super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current !=
      (this->m_vICP).
      super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    ((__position._M_current)->super_DataTypeBase)._vptr_DataTypeBase =
         (_func_int **)&PTR__IntercomCommunicationParameters_00224d88;
    KVar4 = ICP->m_ui16Length;
    uVar3 = *(undefined4 *)&ICP->field_0xc;
    pDVar2 = ICP->m_pRecord;
    (__position._M_current)->m_ui16Type = ICP->m_ui16Type;
    (__position._M_current)->m_ui16Length = KVar4;
    *(undefined4 *)&(__position._M_current)->field_0xc = uVar3;
    (__position._M_current)->m_pRecord = pDVar2;
    (__position._M_current)->m_bMemoryManage = ICP->m_bMemoryManage;
    ppIVar1 = &(this->m_vICP).
               super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + 1;
    return;
  }
  std::
  vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>>
  ::_M_realloc_insert<KDIS::DATA_TYPE::IntercomCommunicationParameters_const&>
            ((vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>>
              *)&this->m_vICP,__position,ICP);
  return;
}

Assistant:

void Intercom_Control_PDU::AddIntercomCommunicationParameters( const IntercomCommunicationParameters & ICP )
{
    m_ui16PDULength += ICP.GetLength() + IntercomCommunicationParameters::INTERCOM_COMMS_PARAM_SIZE;
    m_vICP.push_back( ICP );
}